

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int arkStep_AccessStepMem(ARKodeMem ark_mem,char *fname,ARKodeARKStepMem *step_mem)

{
  int iVar1;
  
  if ((ARKodeARKStepMem)ark_mem->step_mem == (ARKodeARKStepMem)0x0) {
    iVar1 = -0x15;
    arkProcessError(ark_mem,-0x15,0x864,fname,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    *step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkStep_AccessStepMem(ARKodeMem ark_mem, const char* fname,
                          ARKodeARKStepMem* step_mem)
{
  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  *step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  return (ARK_SUCCESS);
}